

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cc
# Opt level: O2

void tvm::runtime::LoadMetaDataFromFile
               (string *file_name,
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::FunctionInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::FunctionInfo>_>_>
               *fmap)

{
  ostream *poVar1;
  allocator<char> local_419;
  string local_418;
  JSONObjectReadHelper helper;
  string version;
  JSONReader reader;
  ifstream fs;
  byte abStack_200 [488];
  
  std::ifstream::ifstream(&fs,(file_name->_M_dataplus)._M_p,_S_in);
  if ((abStack_200[*(long *)(_fs + -0x18)] & 5) != 0) {
    dmlc::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&reader,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/file_util.cc"
               ,0xa0);
    poVar1 = std::operator<<((ostream *)&reader,"Check failed: !fs.fail()");
    poVar1 = std::operator<<(poVar1,": ");
    poVar1 = std::operator<<(poVar1,"Cannot open file ");
    std::operator<<(poVar1,(string *)file_name);
    dmlc::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&reader);
  }
  version._M_dataplus._M_p = (pointer)&version.field_2;
  version._M_string_length = 0;
  version.field_2._M_local_buf[0] = '\0';
  reader.line_count_r_ = 0;
  reader.line_count_n_ = 0;
  reader.scope_counter_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  reader.scope_counter_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  reader.scope_counter_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  helper.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &helper.map_._M_t._M_impl.super__Rb_tree_header._M_header;
  helper.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  helper.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  helper.map_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  helper.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       helper.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  reader.is_ = (istream *)&fs;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,"tvm_version",&local_419);
  dmlc::JSONObjectReadHelper::DeclareField<std::__cxx11::string>(&helper,&local_418,&version);
  std::__cxx11::string::~string((string *)&local_418);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,"func_info",&local_419);
  dmlc::JSONObjectReadHelper::
  DeclareField<std::unordered_map<std::__cxx11::string,tvm::runtime::FunctionInfo,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tvm::runtime::FunctionInfo>>>>
            (&helper,&local_418,fmap);
  std::__cxx11::string::~string((string *)&local_418);
  dmlc::JSONObjectReadHelper::ReadAllFields(&helper,&reader);
  std::ifstream::close();
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry>_>_>
               *)&helper);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&reader.scope_counter_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::__cxx11::string::~string((string *)&version);
  std::ifstream::~ifstream(&fs);
  return;
}

Assistant:

void LoadMetaDataFromFile(
    const std::string &file_name,
    std::unordered_map<std::string, FunctionInfo> *fmap) {
  std::ifstream fs(file_name.c_str());
  CHECK(!fs.fail()) << "Cannot open file " << file_name;
  std::string version;
  dmlc::JSONReader reader(&fs);
  dmlc::JSONObjectReadHelper helper;
  helper.DeclareField("tvm_version", &version);
  helper.DeclareField("func_info", fmap);
  helper.ReadAllFields(&reader);
  fs.close();
}